

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall luna::Lexer::LexStringChar(Lexer *this)

{
  String *pSVar1;
  bool bVar2;
  int iVar3;
  LexException *this_00;
  anon_union_16_2_eed97686_for_String_2 *paVar4;
  char *__nptr;
  int i;
  long lVar5;
  char hex [3];
  char oct [4];
  
  if (this->current_ != 0x5c) goto LAB_00140ba6;
  iVar3 = Next(this);
  this->current_ = iVar3;
  switch(iVar3) {
  case 0x6e:
    break;
  case 0x72:
    break;
  case 0x74:
    break;
  case 0x76:
    break;
  case 0x78:
    iVar3 = Next(this);
    this->current_ = iVar3;
    hex[2] = '\0';
    hex[0] = '\0';
    hex[1] = '\0';
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      bVar2 = anon_unknown.dwarf_c96e2::IsHexChar(iVar3);
      if (!bVar2) {
        if (lVar5 == 0) {
          this_00 = (LexException *)__cxa_allocate_exception(0x20);
          pSVar1 = this->module_;
          if ((pSVar1->super_GCObject).field_0x11 == '\0') {
            paVar4 = &pSVar1->field_1;
          }
          else {
            paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
          }
          LexException::LexException<char_const(&)[30]>
                    (this_00,paVar4->str_buffer_,this->line_,this->column_,
                     (char (*) [30])"unexpect character after \'\\x\'");
          goto LAB_00140c4f;
        }
        break;
      }
      hex[lVar5] = (char)iVar3;
      iVar3 = Next(this);
      this->current_ = iVar3;
    }
    __nptr = hex;
    iVar3 = 0x10;
    goto LAB_00140bd0;
  default:
    if (((((iVar3 == 0x22) || (iVar3 == 0x27)) || (iVar3 == 0x5c)) ||
        ((iVar3 == 0x66 || (iVar3 == 0x62)))) || (iVar3 == 0x61)) break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
    if (9 < iVar3 - 0x30U) {
      this_00 = (LexException *)__cxa_allocate_exception(0x20);
      pSVar1 = this->module_;
      if ((pSVar1->super_GCObject).field_0x11 == '\0') {
        paVar4 = &pSVar1->field_1;
      }
      else {
        paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
      }
      LexException::LexException<char_const(&)[29]>
                (this_00,paVar4->str_buffer_,this->line_,this->column_,
                 (char (*) [29])"unexpect character after \'\\\'");
LAB_00140c4f:
      __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
    }
    oct[0] = '\0';
    oct[1] = '\0';
    oct[2] = '\0';
    oct[3] = '\0';
    lVar5 = 0;
    while ((lVar5 != 3 && (iVar3 - 0x30U < 10))) {
      oct[lVar5] = (char)iVar3;
      lVar5 = lVar5 + 1;
      iVar3 = Next(this);
      this->current_ = iVar3;
    }
    __nptr = oct;
    iVar3 = 8;
LAB_00140bd0:
    strtoul(__nptr,(char **)0x0,iVar3);
    std::__cxx11::string::push_back((char)this + '@');
    return;
  }
LAB_00140ba6:
  std::__cxx11::string::push_back((char)this + '@');
  iVar3 = Next(this);
  this->current_ = iVar3;
  return;
}

Assistant:

void Lexer::LexStringChar()
    {
        if (current_ == '\\')
        {
            current_ = Next();
            if (current_ == 'a')
                token_buffer_.push_back('\a');
            else if (current_ == 'b')
                token_buffer_.push_back('\b');
            else if (current_ == 'f')
                token_buffer_.push_back('\f');
            else if (current_ == 'n')
                token_buffer_.push_back('\n');
            else if (current_ == 'r')
                token_buffer_.push_back('\r');
            else if (current_ == 't')
                token_buffer_.push_back('\t');
            else if (current_ == 'v')
                token_buffer_.push_back('\v');
            else if (current_ == '\\')
                token_buffer_.push_back('\\');
            else if (current_ == '"')
                token_buffer_.push_back('"');
            else if (current_ == '\'')
                token_buffer_.push_back('\'');
            else if (current_ == 'x')
            {
                current_ = Next();
                char hex[3] = { 0 };
                int i = 0;
                for (; i < 2 && IsHexChar(current_); ++i, current_ = Next())
                    hex[i] = current_;
                if (i == 0)
                    throw LexException(module_->GetCStr(), line_, column_,
                            "unexpect character after '\\x'");
                token_buffer_.push_back(static_cast<char>(strtoul(hex, 0, 16)));
                return ;
            }
            else if (isdigit(current_))
            {
                char oct[4] = { 0 };
                for (int i = 0; i < 3 && isdigit(current_); ++i, current_ = Next())
                    oct[i] = current_;
                token_buffer_.push_back(static_cast<char>(strtoul(oct, 0, 8)));
                return ;
            }
            else
                throw LexException(module_->GetCStr(), line_, column_,
                        "unexpect character after '\\'");
        }
        else
        {
            token_buffer_.push_back(current_);
        }

        current_ = Next();
    }